

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot-iostream.h
# Opt level: O0

enable_if_t<IteratorRange<__normal_iterator<const_vector<double>_*,_vector<vector<double>_>_>,_vector<double>_>::is_container>
 gnuplotio::
 deref_and_print<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<std::vector<double,std::allocator<double>>const*,std::vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>>,std::vector<double,std::allocator<double>>>,gnuplotio::ModeBinary>
           (undefined8 stream,
           IteratorRange<__gnu_cxx::__normal_iterator<const_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>,_std::vector<double,_std::allocator<double>_>_>
           *arg)

{
  bool bVar1;
  plotting_empty_container *this;
  undefined1 auStack_40 [7];
  bool first;
  subiter_type subrange;
  IteratorRange<__gnu_cxx::__normal_iterator<const_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>,_std::vector<double,_std::allocator<double>_>_>
  *arg_local;
  ostream *stream_local;
  
  bVar1 = IteratorRange<__gnu_cxx::__normal_iterator<const_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>,_std::vector<double,_std::allocator<double>_>_>
          ::is_end(arg);
  if (bVar1) {
    this = (plotting_empty_container *)__cxa_allocate_exception(0x10);
    plotting_empty_container::plotting_empty_container(this);
    __cxa_throw(this,&plotting_empty_container::typeinfo,
                plotting_empty_container::~plotting_empty_container);
  }
  _auStack_40 = IteratorRange<__gnu_cxx::__normal_iterator<const_std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>,_std::vector<double,_std::allocator<double>_>_>
                ::deref_subiter(arg);
  while (bVar1 = IteratorRange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_double>
                 ::is_end((IteratorRange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_double>
                           *)auStack_40), ((bVar1 ^ 0xffU) & 1) != 0) {
    deref_and_print<gnuplotio::IteratorRange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,double>,gnuplotio::ModeBinary>
              (stream,auStack_40);
    IteratorRange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_double>
    ::inc((IteratorRange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_double>
           *)auStack_40);
  }
  return;
}

Assistant:

typename std::enable_if_t<T::is_container>
deref_and_print(std::ostream &stream, const T &arg, PrintMode) {
    if(arg.is_end()) throw plotting_empty_container();
    typename T::subiter_type subrange = arg.deref_subiter();
    if(PrintMode::is_binfmt && subrange.is_end()) throw plotting_empty_container();
    if(debug_array_print && PrintMode::is_text) stream << "{";
    bool first = true;
    while(!subrange.is_end()) {
        if(!first && PrintMode::is_text) stream << " ";
        first = false;
        deref_and_print(stream, subrange, PrintMode());
        subrange.inc();
    }
    if(debug_array_print && PrintMode::is_text) stream << "}";
}